

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::load_next_row(jpeg_decoder *this)

{
  int iVar1;
  jpgd_quant_t *pjVar2;
  jpgd_block_t *pjVar3;
  jpgd_block_t *pjVar4;
  jpgd_block_t *pjVar5;
  jpeg_decoder *in_RDI;
  jpgd_block_t *pDC;
  jpgd_block_t *pAC;
  int block_y_mcu_ofs;
  int block_x_mcu_ofs;
  int block_x_mcu [4];
  int component_id;
  int component_num;
  int mcu_block;
  int mcu_row;
  jpgd_quant_t *q;
  jpgd_block_t *p;
  int i;
  int in_stack_000001dc;
  jpeg_decoder *in_stack_000001e0;
  int local_50;
  int local_4c;
  int local_48;
  int in_stack_ffffffffffffffbc;
  jpeg_decoder *in_stack_ffffffffffffffc0;
  int local_2c;
  int local_28;
  int local_24;
  int local_c;
  
  memset(&local_48,0,0x10);
  for (local_24 = 0; local_24 < in_RDI->m_mcus_per_row; local_24 = local_24 + 1) {
    local_4c = 0;
    local_50 = 0;
    for (local_28 = 0; local_28 < in_RDI->m_blocks_per_mcu; local_28 = local_28 + 1) {
      iVar1 = in_RDI->m_mcu_org[local_28];
      pjVar2 = in_RDI->m_quant[in_RDI->m_comp_quant[iVar1]];
      pjVar3 = in_RDI->m_pMCU_coefficients + (local_28 << 6);
      pjVar4 = coeff_buf_getp(in_RDI,in_RDI->m_ac_coeffs[iVar1],(&local_48)[iVar1] + local_4c,
                              in_RDI->m_block_y_mcu[iVar1] + local_50);
      pjVar5 = coeff_buf_getp(in_RDI,in_RDI->m_dc_coeffs[iVar1],(&local_48)[iVar1] + local_4c,
                              in_RDI->m_block_y_mcu[iVar1] + local_50);
      *pjVar3 = *pjVar5;
      memcpy(pjVar3 + 1,pjVar4 + 1,0x7e);
      local_c = 0x3f;
      while ((0 < local_c && (pjVar3[*(int *)(g_ZAG + (long)local_c * 4)] == 0))) {
        local_c = local_c + -1;
      }
      in_RDI->m_mcu_block_max_zag[local_28] = local_c + 1;
      for (; -1 < local_c; local_c = local_c + -1) {
        if (pjVar3[*(int *)(g_ZAG + (long)local_c * 4)] != 0) {
          pjVar3[*(int *)(g_ZAG + (long)local_c * 4)] =
               pjVar3[*(int *)(g_ZAG + (long)local_c * 4)] * pjVar2[local_c];
        }
      }
      if (in_RDI->m_comps_in_scan == 1) {
        (&local_48)[iVar1] = (&local_48)[iVar1] + 1;
      }
      else {
        local_4c = local_4c + 1;
        if (local_4c == in_RDI->m_comp_h_samp[iVar1]) {
          local_4c = 0;
          local_50 = local_50 + 1;
          if (local_50 == in_RDI->m_comp_v_samp[iVar1]) {
            local_50 = 0;
            (&local_48)[iVar1] = in_RDI->m_comp_h_samp[iVar1] + (&local_48)[iVar1];
          }
        }
      }
    }
    if ((in_RDI->m_freq_domain_chroma_upsample & 1U) == 0) {
      transform_mcu(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    else {
      transform_mcu_expand(in_stack_000001e0,in_stack_000001dc);
    }
  }
  if (in_RDI->m_comps_in_scan == 1) {
    in_RDI->m_block_y_mcu[in_RDI->m_comp_list[0]] =
         in_RDI->m_block_y_mcu[in_RDI->m_comp_list[0]] + 1;
  }
  else {
    for (local_2c = 0; local_2c < in_RDI->m_comps_in_scan; local_2c = local_2c + 1) {
      iVar1 = in_RDI->m_comp_list[local_2c];
      in_RDI->m_block_y_mcu[iVar1] = in_RDI->m_comp_v_samp[iVar1] + in_RDI->m_block_y_mcu[iVar1];
    }
  }
  return;
}

Assistant:

void jpeg_decoder::load_next_row() {
  int i;
  jpgd_block_t* p;
  jpgd_quant_t* q;
  int mcu_row, mcu_block = 0;
  int component_num, component_id;
  int block_x_mcu[JPGD_MAX_COMPONENTS];

  memset(block_x_mcu, 0, JPGD_MAX_COMPONENTS * sizeof(int));

  for (mcu_row = 0; mcu_row < m_mcus_per_row; mcu_row++) {
    int block_x_mcu_ofs = 0, block_y_mcu_ofs = 0;

    for (mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++) {
      component_id = m_mcu_org[mcu_block];
      q = m_quant[m_comp_quant[component_id]];

      p = m_pMCU_coefficients + 64 * mcu_block;

      jpgd_block_t* pAC = coeff_buf_getp(m_ac_coeffs[component_id], block_x_mcu[component_id] + block_x_mcu_ofs, m_block_y_mcu[component_id] + block_y_mcu_ofs);
      jpgd_block_t* pDC = coeff_buf_getp(m_dc_coeffs[component_id], block_x_mcu[component_id] + block_x_mcu_ofs, m_block_y_mcu[component_id] + block_y_mcu_ofs);
      p[0] = pDC[0];
      memcpy(&p[1], &pAC[1], 63 * sizeof(jpgd_block_t));

      for (i = 63; i > 0; i--)
        if (p[g_ZAG[i]])
          break;

      m_mcu_block_max_zag[mcu_block] = i + 1;

      for (; i >= 0; i--)
        if (p[g_ZAG[i]])
          p[g_ZAG[i]] = static_cast<jpgd_block_t>(p[g_ZAG[i]] * q[i]);

      if (m_comps_in_scan == 1)
        block_x_mcu[component_id]++;
      else {
        if (++block_x_mcu_ofs == m_comp_h_samp[component_id]) {
          block_x_mcu_ofs = 0;

          if (++block_y_mcu_ofs == m_comp_v_samp[component_id]) {
            block_y_mcu_ofs = 0;

            block_x_mcu[component_id] += m_comp_h_samp[component_id];
          }
        }
      }
    }

    if (m_freq_domain_chroma_upsample)
      transform_mcu_expand(mcu_row);
    else
      transform_mcu(mcu_row);
  }

  if (m_comps_in_scan == 1)
    m_block_y_mcu[m_comp_list[0]]++;
  else {
    for (component_num = 0; component_num < m_comps_in_scan; component_num++) {
      component_id = m_comp_list[component_num];

      m_block_y_mcu[component_id] += m_comp_v_samp[component_id];
    }
  }
}